

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal_cv_posix.cpp
# Opt level: O0

void __thiscall
pstore::descriptor_condition_variable::descriptor_condition_variable
          (descriptor_condition_variable *this)

{
  bool bVar1;
  int iVar2;
  value_type vVar3;
  int *piVar4;
  errno_erc local_20;
  value_type local_1c;
  value_type local_18;
  int fds_ [2];
  descriptor_condition_variable *this_local;
  
  this->_vptr_descriptor_condition_variable =
       (_func_int **)&PTR__descriptor_condition_variable_001f2d50;
  unique0x100001c8 = this;
  pstore::details::descriptor<pstore::details::posix_descriptor_traits>::descriptor();
  pstore::details::descriptor<pstore::details::posix_descriptor_traits>::descriptor();
  memset(&local_1c,0,8);
  iVar2 = pipe(&local_1c);
  if (iVar2 == -1) {
    piVar4 = __errno_location();
    errno_erc::errno_erc(&local_20,*piVar4);
    raise<pstore::errno_erc,char[5]>(local_20,(char (*) [5])0x1a12f4);
  }
  pstore::details::descriptor<pstore::details::posix_descriptor_traits>::reset
            (&this->read_fd_,local_1c);
  pstore::details::descriptor<pstore::details::posix_descriptor_traits>::reset
            (&this->write_fd_,local_18);
  bVar1 = pstore::details::descriptor<pstore::details::posix_descriptor_traits>::valid
                    (&this->read_fd_);
  if (!bVar1) {
    assert_failed("read_fd_.valid ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/signal_cv_posix.cpp"
                  ,0x38);
  }
  bVar1 = pstore::details::descriptor<pstore::details::posix_descriptor_traits>::valid
                    (&this->write_fd_);
  if (!bVar1) {
    assert_failed("write_fd_.valid ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/signal_cv_posix.cpp"
                  ,0x39);
  }
  vVar3 = pstore::details::descriptor<pstore::details::posix_descriptor_traits>::native_handle
                    (&this->read_fd_);
  make_non_blocking(vVar3);
  vVar3 = pstore::details::descriptor<pstore::details::posix_descriptor_traits>::native_handle
                    (&this->write_fd_);
  make_non_blocking(vVar3);
  return;
}

Assistant:

descriptor_condition_variable::descriptor_condition_variable () {
        enum { read_index, write_index, last_index };
        int fds_[last_index] = {0};
        if (::pipe (&fds_[0]) == -1) {
            raise (errno_erc{errno}, "pipe");
        }

        read_fd_.reset (fds_[read_index]);
        write_fd_.reset (fds_[write_index]);
        PSTORE_ASSERT (read_fd_.valid ());
        PSTORE_ASSERT (write_fd_.valid ());

        // Make both pipe descriptors non-blocking.
        descriptor_condition_variable::make_non_blocking (read_fd_.native_handle ());
        descriptor_condition_variable::make_non_blocking (write_fd_.native_handle ());
    }